

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupAndCones(Gia_Man_t *p,int *pAnds,int nAnds,int fTrimPis)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  char *pcVar3;
  void *pvVar4;
  uint iCtrl;
  Vec_Ptr_t *vLeaves;
  void **ppvVar5;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vRoots;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  Gia_Obj_t *pGVar10;
  uint uVar11;
  ulong uVar12;
  uint iData1;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  
  vLeaves = (Vec_Ptr_t *)malloc(0x10);
  vLeaves->nCap = 100;
  vLeaves->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  vLeaves->pArray = ppvVar5;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  vNodes->pArray = ppvVar5;
  vRoots = (Vec_Ptr_t *)malloc(0x10);
  vRoots->nCap = 100;
  vRoots->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  vRoots->pArray = ppvVar5;
  if (0 < nAnds) {
    uVar13 = 0;
    do {
      iVar1 = pAnds[uVar13];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001ef5ae;
      pGVar2 = p->pObjs;
      uVar11 = vRoots->nCap;
      if (vRoots->nSize == uVar11) {
        if ((int)uVar11 < 0x10) {
          if (vRoots->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vRoots->pArray,0x80);
          }
          iVar15 = 0x10;
        }
        else {
          iVar15 = uVar11 * 2;
          if (iVar15 <= (int)uVar11) goto LAB_001eefe5;
          if (vRoots->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar11 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(vRoots->pArray,(ulong)uVar11 << 4);
          }
        }
        vRoots->pArray = ppvVar5;
        vRoots->nCap = iVar15;
      }
LAB_001eefe5:
      iVar15 = vRoots->nSize;
      vRoots->nSize = iVar15 + 1;
      vRoots->pArray[iVar15] = pGVar2 + iVar1;
      uVar13 = uVar13 + 1;
    } while ((uint)nAnds != uVar13);
  }
  Gia_ManIncrementTravId(p);
  if (p->nObjs < 1) {
LAB_001ef58f:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->nTravIdsAlloc < 1) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x262,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  *p->pTravIds = p->nTravIds;
  if (0 < vRoots->nSize) {
    lVar16 = 0;
    do {
      Gia_ManDupCones_rec(p,(Gia_Obj_t *)vRoots->pArray[lVar16],vLeaves,vNodes,vRoots);
      lVar16 = lVar16 + 1;
    } while (lVar16 < vRoots->nSize);
  }
  if (1 < (long)vLeaves->nSize) {
    qsort(vLeaves->pArray,(long)vLeaves->nSize,8,Gia_ObjCompareByCioId);
  }
  p_00 = Gia_ManStart(vRoots->nSize + vLeaves->nSize + vNodes->nSize + 1);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar3);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar3);
  }
  p_00->pName = pcVar7;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar3);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar3);
  }
  p_00->pSpec = pcVar7;
  p->pObjs->Value = 0;
  if (fTrimPis == 0) {
    pVVar9 = p->vCis;
    uVar13 = (ulong)(uint)pVVar9->nSize;
    if (p->nRegs < pVVar9->nSize) {
      lVar16 = 0;
      do {
        if ((int)uVar13 <= lVar16) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = pVVar9->pArray[lVar16];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_001ef5ae:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar2 = p->pObjs;
        if (pGVar2 == (Gia_Obj_t *)0x0) break;
        pGVar10 = Gia_ManAppendObj(p_00);
        uVar13 = *(ulong *)pGVar10;
        *(ulong *)pGVar10 = uVar13 | 0x9fffffff;
        *(ulong *)pGVar10 =
             uVar13 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar8 = p_00->pObjs;
        if ((pGVar10 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar10)) goto LAB_001ef58f;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar8) >> 2) * -0x55555555);
        pGVar8 = p_00->pObjs;
        if ((pGVar10 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar10)) goto LAB_001ef58f;
        pGVar2[iVar1].Value = (int)((ulong)((long)pGVar10 - (long)pGVar8) >> 2) * 0x55555556;
        lVar16 = lVar16 + 1;
        pVVar9 = p->vCis;
        uVar13 = (ulong)pVVar9->nSize;
      } while (lVar16 < (long)(uVar13 - (long)p->nRegs));
    }
  }
  else if (0 < vLeaves->nSize) {
    lVar16 = 0;
    do {
      pvVar4 = vLeaves->pArray[lVar16];
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar13 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar2 = p_00->pObjs;
      if ((pGVar8 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar8)) goto LAB_001ef58f;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = p_00->pObjs;
      if ((pGVar8 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar8)) goto LAB_001ef58f;
      *(int *)((long)pvVar4 + 8) = (int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * 0x55555556;
      lVar16 = lVar16 + 1;
    } while (lVar16 < vLeaves->nSize);
  }
  if (0 < vNodes->nSize) {
    lVar16 = 0;
    do {
      pGVar2 = (Gia_Obj_t *)vNodes->pArray[lVar16];
      pGVar8 = p->pObjs;
      if ((pGVar2 < pGVar8) || (pGVar8 + p->nObjs <= pGVar2)) goto LAB_001ef58f;
      if ((p->pMuxes == (uint *)0x0) ||
         (p->pMuxes[(int)((ulong)((long)pGVar2 - (long)pGVar8) >> 2) * -0x55555555] == 0)) {
        uVar13 = *(ulong *)pGVar2;
        uVar12 = uVar13 & 0x1fffffff;
        uVar11 = (uint)(uVar13 >> 0x20);
        if ((uVar12 != 0x1fffffff && -1 < (int)(uint)uVar13) &&
           (((uint)uVar13 & 0x1fffffff) < (uVar11 & 0x1fffffff))) {
          if (((int)pGVar2[-uVar12].Value < 0) ||
             ((int)pGVar2[-(ulong)(uVar11 & 0x1fffffff)].Value < 0)) goto LAB_001ef5cd;
          iCtrl = pGVar2[-uVar12].Value ^ (uint)(uVar13 >> 0x1d) & 1;
          uVar11 = pGVar2[-(ulong)(uVar11 & 0x1fffffff)].Value ^ uVar11 >> 0x1d & 1;
          iData1 = uVar11 ^ 1;
          goto LAB_001ef47f;
        }
        if (((int)pGVar2[-uVar12].Value < 0) ||
           ((int)pGVar2[-(ulong)(uVar11 & 0x1fffffff)].Value < 0)) goto LAB_001ef5cd;
        uVar11 = Gia_ManAppendAnd(p_00,pGVar2[-uVar12].Value ^ (uint)(uVar13 >> 0x1d) & 1,
                                  pGVar2[-(ulong)(uVar11 & 0x1fffffff)].Value ^ uVar11 >> 0x1d & 1);
      }
      else {
        iCtrl = Gia_ObjFanin2Copy(p,pGVar2);
        uVar11 = (uint)((ulong)*(undefined8 *)pGVar2 >> 0x20);
        if ((int)pGVar2[-(ulong)(uVar11 & 0x1fffffff)].Value < 0) {
LAB_001ef5cd:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar14 = (uint)*(undefined8 *)pGVar2;
        if ((int)pGVar2[-(ulong)(uVar14 & 0x1fffffff)].Value < 0) goto LAB_001ef5cd;
        iData1 = uVar11 >> 0x1d & 1 ^ pGVar2[-(ulong)(uVar11 & 0x1fffffff)].Value;
        uVar11 = pGVar2[-(ulong)(uVar14 & 0x1fffffff)].Value ^ uVar14 >> 0x1d & 1;
LAB_001ef47f:
        uVar11 = Gia_ManAppendMux(p_00,iCtrl,iData1,uVar11);
      }
      pGVar2->Value = uVar11;
      lVar16 = lVar16 + 1;
    } while (lVar16 < vNodes->nSize);
  }
  if (0 < vRoots->nSize) {
    lVar16 = 0;
    do {
      Gia_ManAppendCo(p_00,*(int *)((long)vRoots->pArray[lVar16] + 8));
      lVar16 = lVar16 + 1;
    } while (lVar16 < vRoots->nSize);
  }
  Gia_ManSetRegNum(p_00,0);
  if (vLeaves->pArray != (void **)0x0) {
    free(vLeaves->pArray);
    vLeaves->pArray = (void **)0x0;
  }
  free(vLeaves);
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
    vNodes->pArray = (void **)0x0;
  }
  free(vNodes);
  if (vRoots->pArray != (void **)0x0) {
    free(vRoots->pArray);
    vRoots->pArray = (void **)0x0;
  }
  free(vRoots);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupAndCones( Gia_Man_t * p, int * pAnds, int nAnds, int fTrimPis )
{
    Gia_Man_t * pNew;
    Vec_Ptr_t * vLeaves, * vNodes, * vRoots;
    Gia_Obj_t * pObj;
    int i;

    // collect initial POs
    vLeaves = Vec_PtrAlloc( 100 );
    vNodes = Vec_PtrAlloc( 100 );
    vRoots = Vec_PtrAlloc( 100 );
    for ( i = 0; i < nAnds; i++ )
//        Vec_PtrPush( vRoots, Gia_ManPo(p, pPos[i]) );
        Vec_PtrPush( vRoots, Gia_ManObj(p, pAnds[i]) );

    // mark internal nodes
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
        Gia_ManDupCones_rec( p, pObj, vLeaves, vNodes, vRoots );
    Vec_PtrSort( vLeaves, (int (*)(void))Gia_ObjCompareByCioId );

    // start the new manager
//    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Vec_PtrSize(vLeaves) + Vec_PtrSize(vNodes) + Vec_PtrSize(vRoots) + 1);
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // map the constant node
    Gia_ManConst0(p)->Value = 0;
    // create PIs
    if ( fTrimPis )
    {
        Vec_PtrForEachEntry( Gia_Obj_t *, vLeaves, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    else
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    // create LOs
//    Vec_PtrForEachEntryStart( Gia_Obj_t *, vRoots, pObj, i, nPos )
//        Gia_ObjRiToRo(p, pObj)->Value = Gia_ManAppendCi( pNew );
    // create internal nodes
    Vec_PtrForEachEntry( Gia_Obj_t *, vNodes, pObj, i )
        if ( Gia_ObjIsMux(p, pObj) )
            pObj->Value = Gia_ManAppendMux( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManAppendXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else 
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create COs
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
//        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ManAppendCo( pNew, pObj->Value );
    // finalize
//    Gia_ManSetRegNum( pNew, Vec_PtrSize(vRoots)-nPos );
    Gia_ManSetRegNum( pNew, 0 );
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_PtrFree( vRoots );
    return pNew;

}